

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::LayoutBindingBaseCase::setArg(LayoutBindingBaseCase *this,String *arg,String *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar1;
  string local_98 [55];
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  String *value_local;
  String *arg_local;
  LayoutBindingBaseCase *this_local;
  
  local_20 = value;
  value_local = arg;
  arg_local = (String *)this;
  uVar1 = std::__cxx11::string::empty();
  __lhs = local_20;
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60," ",&local_61);
    std::operator+(&local_40,__lhs,&local_60);
    std::__cxx11::string::operator=((string *)value_local,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    std::__cxx11::string::string(local_98);
    std::__cxx11::string::operator=((string *)value_local,local_98);
    std::__cxx11::string::~string(local_98);
  }
  return;
}

Assistant:

void setArg(String& arg, const String& value) const
	{
		if (!value.empty())
			arg = value + String(" ");
		else
			arg = String();
	}